

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_file.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::java::FileGenerator::FileGenerator
          (FileGenerator *this,FileDescriptor *file,Options *options,bool immutable_api)

{
  scoped_ptr<google::protobuf::compiler::java::GeneratorFactory> *this_00;
  ulong uVar1;
  ulong uVar2;
  int iVar3;
  long *plVar4;
  Context *pCVar5;
  ClassNameResolver *pCVar6;
  ImmutableGeneratorFactory *this_01;
  scoped_ptr<google::protobuf::compiler::java::MessageGenerator> *this_02;
  GeneratorFactory *pGVar7;
  undefined4 extraout_var;
  FileDescriptor *pFVar8;
  scoped_ptr<google::protobuf::compiler::java::ExtensionGenerator> *this_03;
  undefined4 extraout_var_00;
  undefined7 in_register_00000009;
  int i;
  ulong uVar9;
  long lVar10;
  long lVar11;
  string local_50;
  
  this->file_ = file;
  FileJavaPackage_abi_cxx11_
            (&this->java_package_,(java *)file,
             (FileDescriptor *)(CONCAT71(in_register_00000009,immutable_api) & 0xffffffff),
             immutable_api);
  (this->classname_)._M_dataplus._M_p = (pointer)&(this->classname_).field_2;
  (this->classname_)._M_string_length = 0;
  (this->classname_).field_2._M_local_buf[0] = '\0';
  iVar3 = *(int *)(file + 0x58);
  lVar10 = (long)iVar3;
  uVar1 = lVar10 * 8;
  uVar2 = 0xffffffffffffffff;
  uVar9 = uVar1 + 8;
  if (0xfffffffffffffff7 < uVar1) {
    uVar9 = uVar2;
  }
  if (lVar10 < 0) {
    uVar9 = uVar2;
  }
  plVar4 = (long *)operator_new__(uVar9);
  *plVar4 = lVar10;
  if (iVar3 != 0) {
    memset((scoped_ptr<google::protobuf::compiler::java::MessageGenerator> *)(plVar4 + 1),0,uVar1);
  }
  (this->message_generators_).array_ =
       (scoped_ptr<google::protobuf::compiler::java::MessageGenerator> *)(plVar4 + 1);
  iVar3 = *(int *)(file + 0x88);
  lVar10 = (long)iVar3;
  uVar1 = lVar10 * 8;
  uVar9 = uVar1 + 8;
  if (0xfffffffffffffff7 < uVar1) {
    uVar9 = uVar2;
  }
  if (lVar10 < 0) {
    uVar9 = uVar2;
  }
  plVar4 = (long *)operator_new__(uVar9);
  *plVar4 = lVar10;
  if (iVar3 != 0) {
    memset((scoped_ptr<google::protobuf::compiler::java::ExtensionGenerator> *)(plVar4 + 1),0,uVar1)
    ;
  }
  (this->extension_generators_).array_ =
       (scoped_ptr<google::protobuf::compiler::java::ExtensionGenerator> *)(plVar4 + 1);
  (this->generator_factory_).ptr_ = (GeneratorFactory *)0x0;
  pCVar5 = (Context *)operator_new(0xb0);
  this_00 = &this->generator_factory_;
  Context::Context(pCVar5,file,options);
  (this->context_).ptr_ = pCVar5;
  pCVar5 = internal::scoped_ptr<google::protobuf::compiler::java::Context>::operator->
                     (&this->context_);
  pCVar6 = Context::GetNameResolver(pCVar5);
  this->name_resolver_ = pCVar6;
  Options::Options(&this->options_,options);
  this->immutable_api_ = immutable_api;
  ClassNameResolver::GetFileClassName_abi_cxx11_(&local_50,this->name_resolver_,file,immutable_api);
  std::__cxx11::string::operator=((string *)&this->classname_,(string *)&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  this_01 = (ImmutableGeneratorFactory *)operator_new(0x10);
  ImmutableGeneratorFactory::ImmutableGeneratorFactory(this_01,(this->context_).ptr_);
  internal::scoped_ptr<google::protobuf::compiler::java::GeneratorFactory>::reset
            (this_00,(GeneratorFactory *)this_01);
  lVar11 = 0;
  for (lVar10 = 0; pFVar8 = this->file_, lVar10 < *(int *)(pFVar8 + 0x58); lVar10 = lVar10 + 1) {
    this_02 = internal::
              scoped_array<google::protobuf::internal::scoped_ptr<google::protobuf::compiler::java::MessageGenerator>_>
              ::operator[](&this->message_generators_,lVar10);
    pGVar7 = internal::scoped_ptr<google::protobuf::compiler::java::GeneratorFactory>::operator->
                       (this_00);
    iVar3 = (*pGVar7->_vptr_GeneratorFactory[2])(pGVar7,*(long *)(this->file_ + 0x60) + lVar11);
    internal::scoped_ptr<google::protobuf::compiler::java::MessageGenerator>::reset
              (this_02,(MessageGenerator *)CONCAT44(extraout_var,iVar3));
    lVar11 = lVar11 + 0xa8;
  }
  lVar11 = 0;
  for (lVar10 = 0; lVar10 < *(int *)(pFVar8 + 0x88); lVar10 = lVar10 + 1) {
    this_03 = internal::
              scoped_array<google::protobuf::internal::scoped_ptr<google::protobuf::compiler::java::ExtensionGenerator>_>
              ::operator[](&this->extension_generators_,lVar10);
    pGVar7 = internal::scoped_ptr<google::protobuf::compiler::java::GeneratorFactory>::operator->
                       (this_00);
    iVar3 = (*pGVar7->_vptr_GeneratorFactory[3])(pGVar7,*(long *)(this->file_ + 0x98) + lVar11);
    internal::scoped_ptr<google::protobuf::compiler::java::ExtensionGenerator>::reset
              (this_03,(ExtensionGenerator *)CONCAT44(extraout_var_00,iVar3));
    pFVar8 = this->file_;
    lVar11 = lVar11 + 0xa8;
  }
  return;
}

Assistant:

FileGenerator::FileGenerator(const FileDescriptor* file, const Options& options,
                             bool immutable_api)
    : file_(file),
      java_package_(FileJavaPackage(file, immutable_api)),
      message_generators_(
          new google::protobuf::scoped_ptr<MessageGenerator>[file->message_type_count()]),
      extension_generators_(
          new google::protobuf::scoped_ptr<ExtensionGenerator>[file->extension_count()]),
      context_(new Context(file, options)),
      name_resolver_(context_->GetNameResolver()),
      options_(options),
      immutable_api_(immutable_api) {
  classname_ = name_resolver_->GetFileClassName(file, immutable_api);
  generator_factory_.reset(
      new ImmutableGeneratorFactory(context_.get()));
  for (int i = 0; i < file_->message_type_count(); ++i) {
    message_generators_[i].reset(
        generator_factory_->NewMessageGenerator(file_->message_type(i)));
  }
  for (int i = 0; i < file_->extension_count(); ++i) {
    extension_generators_[i].reset(
        generator_factory_->NewExtensionGenerator(file_->extension(i)));
  }
}